

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_nodesel.cc
# Opt level: O2

RC __thiscall QL_NodeSel::PrintNode(QL_NodeSel *this,int numTabs)

{
  char **ppcVar1;
  Condition *pCVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Condition condition;
  Condition *pCVar5;
  ostream *poVar6;
  int i;
  int iVar7;
  long lVar8;
  int iVar9;
  bool bVar10;
  
  iVar9 = 0;
  iVar7 = 0;
  if (0 < numTabs) {
    iVar9 = numTabs;
    iVar7 = numTabs;
  }
  while (iVar9 != 0) {
    std::operator<<((ostream *)&std::cout,"\t");
    iVar9 = iVar9 + -1;
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"--SEL: ");
  std::endl<char,std::char_traits<char>>(poVar6);
  for (lVar8 = 0; iVar9 = iVar7, lVar8 < (this->super_QL_Node).condIndex; lVar8 = lVar8 + 1) {
    while (bVar10 = iVar9 != 0, iVar9 = iVar9 + -1, bVar10) {
      std::operator<<((ostream *)&std::cout,"\t");
    }
    pCVar2 = ((this->super_QL_Node).qlm)->condptr;
    iVar9 = (this->super_QL_Node).condsInNode[lVar8];
    pCVar5 = pCVar2 + iVar9;
    uVar3 = pCVar5->op;
    uVar4 = pCVar5->bRhsIsAttr;
    condition.bRhsIsAttr = uVar4;
    condition.op = uVar3;
    ppcVar1 = &pCVar2[iVar9].rhsAttr.attrName;
    condition.lhsAttr = pCVar2[iVar9].lhsAttr;
    condition.rhsAttr.relName = ((RelAttr *)(&pCVar5->op + 2))->relName;
    condition.rhsAttr.attrName = *ppcVar1;
    condition.rhsValue._0_8_ = ppcVar1[1];
    condition.rhsValue.data = pCVar2[iVar9].rhsValue.data;
    QL_Node::PrintCondition(&this->super_QL_Node,condition);
    std::operator<<((ostream *)&std::cout,"\n");
  }
  (*this->prevNode->_vptr_QL_Node[5])(this->prevNode,(ulong)(numTabs + 1));
  return 0;
}

Assistant:

RC QL_NodeSel::PrintNode(int numTabs){
  for(int i=0; i < numTabs; i++){
    cout << "\t";
  }
  cout << "--SEL: " << endl;
  for(int i = 0; i < condIndex; i++){
    for(int j=0; j <numTabs; j++){
      cout << "\t";
    }
    PrintCondition(qlm.condptr[condsInNode[i]]);
    cout << "\n";
  }
  prevNode.PrintNode(numTabs + 1);

  return (0);
}